

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void block_rd_txfm(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                  TX_SIZE tx_size,void *arg)

{
  int iVar1;
  int iVar2;
  AV1_COMMON *cm_00;
  long lVar3;
  int in_ECX;
  long lVar4;
  int in_EDX;
  uint uVar5;
  int in_ESI;
  int in_EDI;
  uint in_R8D;
  byte in_R9B;
  MACROBLOCK *x_00;
  uint uVar6;
  undefined8 *in_stack_00000008;
  int64_t skip_txfm_rd;
  int64_t no_skip_txfm_rd;
  int64_t rd;
  TxfmSearchInfo *txfm_info;
  int blk_idx;
  TXB_CTX txb_ctx;
  TxfmSearchParams *txfm_params;
  RD_STATS this_rd_stats;
  AV1_COMMON *cm;
  ENTROPY_CONTEXT *l;
  ENTROPY_CONTEXT *a;
  AV1_COMP *cpi;
  int is_inter;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  rdcost_block_args *args;
  MACROBLOCK *in_stack_00000108;
  AV1_COMP *in_stack_00000110;
  BLOCK_SIZE in_stack_00000140;
  TX_SIZE in_stack_00000148;
  TXB_CTX *in_stack_00000150;
  FAST_TX_SEARCH_MODE in_stack_00000158;
  int in_stack_00000160;
  int64_t in_stack_00000168;
  RD_STATS *in_stack_00000170;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  ENTROPY_CONTEXT *in_stack_fffffffffffffee8;
  ENTROPY_CONTEXT *a_00;
  int in_stack_fffffffffffffef0;
  TX_SIZE in_stack_fffffffffffffef6;
  BLOCK_SIZE in_stack_fffffffffffffef7;
  int block_00;
  int in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff10;
  undefined2 uVar7;
  uint col;
  int iVar8;
  int iVar9;
  undefined8 in_stack_ffffffffffffff38;
  TX_SIZE tx_size_00;
  undefined8 in_stack_ffffffffffffff40;
  BLOCK_SIZE in_stack_ffffffffffffff4b;
  int in_stack_ffffffffffffff4c;
  MACROBLOCK *in_stack_ffffffffffffff50;
  int local_a0;
  long local_98;
  TX_SIZE in_stack_ffffffffffffff76;
  BLOCK_SIZE in_stack_ffffffffffffff77;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint8_t in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  undefined8 uVar10;
  uint in_stack_ffffffffffffffa8;
  
  uVar7 = (undefined2)((ulong)in_stack_ffffffffffffff10 >> 0x30);
  tx_size_00 = (TX_SIZE)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  if (*(int *)(in_stack_00000008 + 0x11) == 0) {
    lVar4 = in_stack_00000008[1];
    cm_00 = (AV1_COMMON *)(lVar4 + 0x1a0);
    col = in_R8D;
    iVar2 = in_ECX;
    iVar8 = in_EDX;
    iVar9 = in_ESI;
    iVar1 = is_inter_block((MB_MODE_INFO *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    uVar10 = *in_stack_00000008;
    lVar3 = (long)in_stack_00000008 + (long)in_ECX + 0x10;
    av1_init_rd_stats((RD_STATS *)&local_a0);
    if (iVar1 == 0) {
      av1_predict_intra_block_facade
                (cm_00,(MACROBLOCKD *)(ulong)in_stack_ffffffffffffffa8,(int)((ulong)uVar10 >> 0x20),
                 (int)uVar10,(int)((ulong)lVar3 >> 0x20),(TX_SIZE)((ulong)lVar3 >> 0x18));
      av1_subtract_txb(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff4b
                       ,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                       (int)in_stack_ffffffffffffff40,tx_size_00);
      if (((*(byte *)(lVar4 + 0x24e01) & 1) != 0) &&
         (ml_predict_intra_tx_depth_prune
                    ((MACROBLOCK *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,
                     in_stack_ffffffffffffff76), *(char *)(lVar4 + 0x24e00) == '\x01')) {
        av1_invalid_rd_stats((RD_STATS *)(in_stack_00000008 + 10));
        *(undefined4 *)(in_stack_00000008 + 0x11) = 1;
        return;
      }
    }
    get_txb_ctx(in_stack_fffffffffffffef7,in_stack_fffffffffffffef6,in_stack_fffffffffffffef0,
                in_stack_fffffffffffffee8,
                (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                (TXB_CTX *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    block_00 = *(int *)((long)in_stack_00000008 + 0x94);
    x_00 = (MACROBLOCK *)(in_stack_00000008[0x10] - in_stack_00000008[0xf]);
    a_00 = &stack0xffffffffffffff50;
    uVar6 = in_R8D & 0xff;
    uVar5 = (uint)in_R9B;
    search_tx_type(in_stack_00000110,in_stack_00000108,plane,block,blk_row,blk_col,in_stack_00000140
                   ,in_stack_00000148,in_stack_00000150,in_stack_00000158,in_stack_00000160,
                   in_stack_00000168,in_stack_00000170);
    if ((in_EDI == 0) && (*(int *)((cm_00->quant_params).gqmatrix[0xf][0] + 0x12) != 0)) {
      cfl_store_tx((MACROBLOCKD *)CONCAT44(iVar9,iVar8),iVar2,col,(TX_SIZE)((ushort)uVar7 >> 8),
                   (BLOCK_SIZE)uVar7);
    }
    av1_set_txb_context(x_00,in_stack_fffffffffffffefc,block_00,in_stack_fffffffffffffef7,a_00,
                        (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffee4,uVar5));
    iVar2 = in_EDX * ((int)(uint)block_size_wide[(byte)in_R8D] >> 2) + in_ECX;
    if (in_EDI == 0) {
      set_blk_skip((uint8_t *)(lVar4 + 0x24e09),0,iVar2,
                   (uint)(*(short *)(*(long *)(lVar4 + 0x20) + (long)in_ESI * 2) == 0));
    }
    else {
      set_blk_skip((uint8_t *)(lVar4 + 0x24e09),in_EDI,iVar2,0);
    }
    if (iVar1 == 0) {
      lVar4 = ((long)local_a0 * (long)*(int *)(lVar4 + 0x4218) + 0x100 >> 9) + local_98 * 0x80;
    }
    else {
      lVar3 = ((long)local_a0 * (long)*(int *)(lVar4 + 0x4218) + 0x100 >> 9) + local_98 * 0x80;
      lVar4 = CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78) * 0x80;
      if (lVar3 < lVar4) {
        lVar4 = lVar3;
      }
    }
    av1_merge_rd_stats((RD_STATS *)CONCAT44(in_stack_fffffffffffffee4,uVar5),
                       (RD_STATS *)CONCAT44(in_stack_fffffffffffffedc,uVar6));
    in_stack_00000008[0xf] = lVar4 + in_stack_00000008[0xf];
    if ((long)in_stack_00000008[0x10] < (long)in_stack_00000008[0xf]) {
      *(undefined4 *)(in_stack_00000008 + 0x11) = 1;
    }
  }
  else {
    *(undefined4 *)((long)in_stack_00000008 + 0x8c) = 1;
  }
  return;
}

Assistant:

static inline void block_rd_txfm(int plane, int block, int blk_row, int blk_col,
                                 BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                                 void *arg) {
  struct rdcost_block_args *args = arg;
  if (args->exit_early) {
    args->incomplete_exit = 1;
    return;
  }

  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int is_inter = is_inter_block(xd->mi[0]);
  const AV1_COMP *cpi = args->cpi;
  ENTROPY_CONTEXT *a = args->t_above + blk_col;
  ENTROPY_CONTEXT *l = args->t_left + blk_row;
  const AV1_COMMON *cm = &cpi->common;
  RD_STATS this_rd_stats;
  av1_init_rd_stats(&this_rd_stats);

  if (!is_inter) {
    av1_predict_intra_block_facade(cm, xd, plane, blk_col, blk_row, tx_size);
    av1_subtract_txb(x, plane, plane_bsize, blk_col, blk_row, tx_size);
#if !CONFIG_REALTIME_ONLY
    const TxfmSearchParams *const txfm_params = &x->txfm_search_params;
    if (txfm_params->enable_nn_prune_intra_tx_depths) {
      ml_predict_intra_tx_depth_prune(x, blk_row, blk_col, plane_bsize,
                                      tx_size);
      if (txfm_params->nn_prune_depths_for_intra_tx == TX_PRUNE_LARGEST) {
        av1_invalid_rd_stats(&args->rd_stats);
        args->exit_early = 1;
        return;
      }
    }
#endif
  }

  TXB_CTX txb_ctx;
  get_txb_ctx(plane_bsize, tx_size, plane, a, l, &txb_ctx);
  search_tx_type(cpi, x, plane, block, blk_row, blk_col, plane_bsize, tx_size,
                 &txb_ctx, args->ftxs_mode, args->skip_trellis,
                 args->best_rd - args->current_rd, &this_rd_stats);

#if !CONFIG_REALTIME_ONLY
  if (plane == AOM_PLANE_Y && xd->cfl.store_y) {
    assert(!is_inter || plane_bsize < BLOCK_8X8);
    cfl_store_tx(xd, blk_row, blk_col, tx_size, plane_bsize);
  }
#endif

#if CONFIG_RD_DEBUG
  update_txb_coeff_cost(&this_rd_stats, plane, this_rd_stats.rate);
#endif  // CONFIG_RD_DEBUG
  av1_set_txb_context(x, plane, block, tx_size, a, l);

  const int blk_idx =
      blk_row * (block_size_wide[plane_bsize] >> MI_SIZE_LOG2) + blk_col;

  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  if (plane == 0)
    set_blk_skip(txfm_info->blk_skip, plane, blk_idx,
                 x->plane[plane].eobs[block] == 0);
  else
    set_blk_skip(txfm_info->blk_skip, plane, blk_idx, 0);

  int64_t rd;
  if (is_inter) {
    const int64_t no_skip_txfm_rd =
        RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);
    const int64_t skip_txfm_rd = RDCOST(x->rdmult, 0, this_rd_stats.sse);
    rd = AOMMIN(no_skip_txfm_rd, skip_txfm_rd);
    this_rd_stats.skip_txfm &= !x->plane[plane].eobs[block];
  } else {
    // Signal non-skip_txfm for Intra blocks
    rd = RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);
    this_rd_stats.skip_txfm = 0;
  }

  av1_merge_rd_stats(&args->rd_stats, &this_rd_stats);

  args->current_rd += rd;
  if (args->current_rd > args->best_rd) args->exit_early = 1;
}